

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O0

void highbd_update_mask0(__m128i *qcoeff0,__m128i *qcoeff1,__m128i *threshold,int16_t *iscan_ptr,
                        int *is_found,__m128i *mask)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int16_t *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int *in_R8;
  __m128i *in_R9;
  __m128i cmp_mask1;
  __m128i cmp_mask0;
  __m128i coeff [2];
  undefined1 local_108 [8];
  undefined8 uStack_100;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  longlong local_58;
  longlong lStack_50;
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  uVar1 = *in_RDI;
  uStack_70 = in_RDI[1];
  local_1c = 5;
  local_18._0_4_ = (int)uVar1;
  local_18._4_4_ = (int)((ulong)uVar1 >> 0x20);
  uStack_10._0_4_ = (int)uStack_70;
  uStack_10._4_4_ = (int)((ulong)uStack_70 >> 0x20);
  local_f8 = (int)local_18 << 5;
  iStack_f4 = local_18._4_4_;
  iStack_f0 = (int)uStack_10;
  iStack_ec = uStack_10._4_4_;
  local_78 = CONCAT44(local_18._4_4_,local_f8);
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  local_88._0_4_ = (int)uVar2;
  local_88._4_4_ = (int)((ulong)uVar2 >> 0x20);
  uStack_80._0_4_ = (int)uVar3;
  uStack_80._4_4_ = (int)((ulong)uVar3 >> 0x20);
  local_108._4_4_ = -(uint)(local_88._4_4_ < local_18._4_4_);
  local_108._0_4_ = -(uint)((int)local_88 < local_f8);
  uStack_100._0_4_ = -(uint)((int)uStack_80 < (int)uStack_10);
  uStack_100._4_4_ = -(uint)(uStack_80._4_4_ < uStack_10._4_4_);
  uVar4 = *in_RSI;
  uStack_90 = in_RSI[1];
  local_3c = 5;
  local_38._0_4_ = (int)uVar4;
  local_38._4_4_ = (int)((ulong)uVar4 >> 0x20);
  uStack_30._0_4_ = (int)uStack_90;
  uStack_30._4_4_ = (int)((ulong)uStack_90 >> 0x20);
  local_e8 = (int)local_38 << 5;
  iStack_e4 = local_38._4_4_;
  iStack_e0 = (int)uStack_30;
  iStack_dc = uStack_30._4_4_;
  local_98 = CONCAT44(local_38._4_4_,local_e8);
  uVar5 = in_RDX[2];
  uVar6 = in_RDX[3];
  local_a8._0_4_ = (int)uVar5;
  local_a8._4_4_ = (int)((ulong)uVar5 >> 0x20);
  uStack_a0._0_4_ = (int)uVar6;
  uStack_a0._4_4_ = (int)((ulong)uVar6 >> 0x20);
  local_68 = CONCAT44(-(uint)(local_a8._4_4_ < local_38._4_4_),-(uint)((int)local_a8 < local_e8));
  uStack_60 = CONCAT44(-(uint)(uStack_a0._4_4_ < uStack_30._4_4_),
                       -(uint)((int)uStack_a0 < (int)uStack_30));
  local_58 = (longlong)local_108;
  lStack_50 = uStack_100;
  auVar8._8_8_ = uStack_100;
  auVar8._0_8_ = local_108;
  auVar7._8_8_ = uStack_60;
  auVar7._0_8_ = local_68;
  _local_108 = (__m128i)packssdw(auVar8,auVar7);
  local_a8 = uVar5;
  uStack_a0 = uVar6;
  local_88 = uVar2;
  uStack_80 = uVar3;
  local_38 = uVar4;
  uStack_30 = uStack_90;
  local_18 = uVar1;
  uStack_10 = uStack_70;
  highbd_update_mask1((__m128i *)local_108,in_RCX,in_R8,in_R9);
  return;
}

Assistant:

static inline void highbd_update_mask0(__m128i *qcoeff0, __m128i *qcoeff1,
                                       __m128i *threshold,
                                       const int16_t *iscan_ptr, int *is_found,
                                       __m128i *mask) {
  __m128i coeff[2], cmp_mask0, cmp_mask1;

  coeff[0] = _mm_slli_epi32(*qcoeff0, AOM_QM_BITS);
  cmp_mask0 = _mm_cmpgt_epi32(coeff[0], threshold[0]);
  coeff[1] = _mm_slli_epi32(*qcoeff1, AOM_QM_BITS);
  cmp_mask1 = _mm_cmpgt_epi32(coeff[1], threshold[1]);

  cmp_mask0 = _mm_packs_epi32(cmp_mask0, cmp_mask1);

  highbd_update_mask1(&cmp_mask0, iscan_ptr, is_found, mask);
}